

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O2

void __thiscall
tchecker::algorithms::couvscc::
generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::merge_scc
          (generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>
           *this,node_sptr_t *n,stats_t *stats,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels)

{
  uint uVar1;
  bool bVar2;
  node_t *pnVar3;
  uint *puVar4;
  bool *pbVar5;
  _Elt_pointer prVar6;
  node_sptr_t u;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> scc_labels;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  iStack_88;
  stats_t *local_80;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  roots_stack_entry_t local_58;
  
  local_80 = stats;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_78,labels->m_num_bits,0,(allocator<unsigned_long> *)&local_58);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t
            (&iStack_88,
             (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
              *)0x0);
  do {
    prVar6 = (this->_roots).c.
             super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (prVar6 == (this->_roots).c.
                  super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      prVar6 = (this->_roots).c.
               super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
    }
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
    ::operator=(&iStack_88,&prVar6[-1].n);
    prVar6 = (this->_roots).c.
             super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (prVar6 == (this->_roots).c.
                  super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      prVar6 = (this->_roots).c.
               super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator|=
              (&local_78,&prVar6[-1].labels);
    bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none(labels);
    if (!bVar2) {
      bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                        (labels,&local_78);
      if (bVar2) {
        pbVar5 = stats_t::cycle(local_80);
        *pbVar5 = true;
        goto LAB_00127af7;
      }
    }
    std::
    deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
    ::pop_back(&(this->_roots).c);
    pnVar3 = (node_t *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
             ::operator->(&iStack_88);
    puVar4 = couvscc::node_t::dfsnum(pnVar3);
    uVar1 = *puVar4;
    pnVar3 = (node_t *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
             ::operator->(n);
    puVar4 = couvscc::node_t::dfsnum(pnVar3);
  } while (*puVar4 < uVar1);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t(&local_58.n,&iStack_88);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_58.labels,&local_78);
  std::
  deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>
            ((deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
              *)&this->_roots,&local_58);
  roots_stack_entry_t::~roots_stack_entry_t(&local_58);
LAB_00127af7:
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&iStack_88);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_78);
  return;
}

Assistant:

void merge_scc(node_sptr_t & n, tchecker::algorithms::couvscc::stats_t & stats, boost::dynamic_bitset<> const & labels)
  {
    boost::dynamic_bitset<> scc_labels{labels.size(), 0};
    node_sptr_t u{nullptr};
    do {
      u = _roots.top().n;
      scc_labels |= _roots.top().labels;
      if (!labels.none() && labels.is_subset_of(scc_labels)) {
        stats.cycle() = true;
        return;
      }
      _roots.pop();
    } while (u->dfsnum() > n->dfsnum());
    _roots.push(roots_stack_entry_t{u, scc_labels});
  }